

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_580a1::MapDrivePlugIn::redraw
          (MapDrivePlugIn *this,float currentTime,float elapsedTime)

{
  size_type segmentIndex;
  MapDriver *pMVar1;
  long lVar2;
  Color CVar3;
  MapDrivePlugIn *pMVar4;
  bool bVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  ostringstream *status_00;
  ostringstream *status_01;
  ostringstream *status_02;
  ostringstream *status_03;
  Color *color_00;
  int j;
  int iVar7;
  int iVar8;
  char *pcVar9;
  TerrainMap *pTVar10;
  ulong uVar11;
  int i;
  int i_00;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float fVar12;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Vec3 VVar21;
  Vec3 g;
  Vec3 nextRow;
  float fStack_25c;
  Vec3 local_228;
  undefined1 local_218 [24];
  MapDrivePlugIn *local_200;
  Vec3 local_1f8;
  Vec3 local_1e8;
  Color color;
  Vec3 local_1b8;
  ostringstream status;
  float fStack_1a4;
  
  fStack_25c = nextRow.y;
  OpenSteer::OpenSteerDemo::updateCamera(currentTime,elapsedTime,(AbstractVehicle *)this->vehicle);
  color.r_ = 400.0;
  color.g_ = -0.2;
  color.b_ = 400.0;
  nextRow.z = -400.0;
  nextRow.x = 400.0;
  nextRow.y = -0.2;
  g.x = -400.0;
  g.y = -0.2;
  g.z = -400.0;
  local_228.x = -400.0;
  local_228.y = -0.2;
  local_228.z = 400.0;
  OpenSteer::Color::Color((Color *)&status,0.8,0.7,0.5,1.0);
  OpenSteer::drawQuadrangle((Vec3 *)&color,&nextRow,&g,&local_228,(Color *)&status);
  pMVar1 = this->vehicle;
  pTVar10 = pMVar1->map;
  fVar15 = pTVar10->xSize;
  fVar17 = fVar15 / (float)pTVar10->resolution;
  color.g_ = 0.0;
  color.b_ = 0.0;
  nextRow.y = 0.0;
  nextRow.x = -fVar15;
  fVar18 = pTVar10->zSize / (float)pTVar10->resolution;
  nextRow.z = fVar18;
  g.x = (fVar15 - fVar17) * -0.5;
  g.z = (pTVar10->zSize - fVar18) * -0.5;
  g.y = 0.0;
  local_200 = this;
  color.r_ = fVar17;
  OpenSteer::Vec3::operator+=(&g,&pTVar10->center);
  fVar17 = fVar17 * 0.5;
  local_218._0_16_ = ZEXT416((uint)fVar17);
  iVar7 = 0;
  fVar15 = fVar17;
  while( true ) {
    pTVar10 = pMVar1->map;
    iVar8 = pTVar10->resolution;
    if (iVar8 <= iVar7) break;
    for (i_00 = 0; i_00 < iVar8; i_00 = i_00 + 1) {
      bVar5 = TerrainMap::getMapBit(pTVar10,i_00,iVar7);
      if (bVar5) {
        OpenSteer::Color::Color((Color *)&status,0.5,0.2,0.0,1.0);
        fVar15 = (float)local_218._4_4_ + g.y;
        local_228.z = fVar18 * 0.5 + g.z;
        local_228.y = fVar15;
        local_228.x = (float)local_218._0_4_ + g.x;
        local_1f8.z = g.z - fVar18 * 0.5;
        local_1e8.y = fVar15;
        local_1e8.x = (float)local_218._0_4_ + g.x;
        local_1f8.y = fVar15;
        local_1f8.x = g.x - fVar17;
        local_1b8.y = fVar15;
        local_1b8.x = g.x - fVar17;
        local_1e8.z = local_1f8.z;
        local_1b8.z = local_228.z;
        OpenSteer::drawQuadrangle(&local_228,&local_1e8,&local_1f8,&local_1b8,(Color *)&status);
      }
      OpenSteer::Vec3::operator+=(&g,(Vec3 *)&color);
      pTVar10 = pMVar1->map;
      iVar8 = pTVar10->resolution;
    }
    VVar21 = OpenSteer::Vec3::operator+=(&g,&nextRow);
    fVar15 = VVar21.z;
    iVar7 = iVar7 + 1;
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    pMVar1 = local_200->vehicle;
    OpenSteer::Color::Color((Color *)&status,0.0,0.5,0.5,1.0);
    OpenSteer::Color::Color(&color,0.8,0.7,0.5,1.0);
    _nextRow = OpenSteer::interpolate<OpenSteer::Color>(0.1,&color,(Color *)&status);
    fVar15 = nextRow.z;
    uVar11 = 1;
    while( true ) {
      iVar7 = (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])();
      if (CONCAT44(extraout_var,iVar7) <= uVar11) break;
      (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pMVar1->path,uVar11);
      g.x = extraout_XMM0_Da + 0.0;
      g.y = extraout_XMM0_Db + -0.1;
      fVar15 = fVar15 + 0.0;
      segmentIndex = uVar11 - 1;
      g.z = fVar15;
      (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
                (pMVar1->path,segmentIndex);
      fVar15 = fVar15 + 0.0;
      local_228.y = extraout_XMM0_Db_00 + -0.1;
      local_228.x = extraout_XMM0_Da_00 + 0.0;
      local_228.z = fVar15;
      fVar17 = OpenSteer::PolylineSegmentedPathwaySegmentRadii::segmentRadius
                         (pMVar1->path,segmentIndex);
      OpenSteer::drawXZWideLine(&g,&local_228,(Color *)&nextRow,fVar17 + fVar17);
      (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pMVar1->path,uVar11);
      local_1e8.y = extraout_XMM0_Db_01;
      local_1e8.x = extraout_XMM0_Da_01;
      local_1e8.z = fVar15;
      (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
                (pMVar1->path,segmentIndex);
      local_1f8.y = extraout_XMM0_Db_02;
      local_1f8.x = extraout_XMM0_Da_02;
      local_1f8.z = fVar15;
      OpenSteer::drawLine(&local_1e8,&local_1f8,(Color *)&status);
      OpenSteer::drawXZDisk(fVar17,&g,(Color *)&nextRow,0x18);
      OpenSteer::drawXZDisk(fVar17,&local_228,(Color *)&nextRow,0x18);
      uVar11 = uVar11 + 1;
    }
  }
  pMVar4 = local_200;
  pMVar1 = local_200->vehicle;
  _status = (float)OpenSteer::gBlack._0_4_;
  fStack_1a4 = (float)OpenSteer::gBlack._4_4_;
  if (pMVar1->stuck == true) {
    _status = (float)OpenSteer::gYellow._0_4_;
    fStack_1a4 = (float)OpenSteer::gYellow._4_4_;
  }
  bVar5 = MapDriver::bodyInsidePath(pMVar1);
  if (!bVar5) {
    fStack_1a4 = (float)OpenSteer::gOrange._4_4_;
    _status = (float)OpenSteer::gOrange._0_4_;
  }
  if (pMVar1->collisionDetected == true) {
    fStack_1a4 = (float)OpenSteer::gRed._4_4_;
    _status = (float)OpenSteer::gRed._0_4_;
  }
  (*(pMVar1->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(pMVar1);
  local_218._0_4_ = fVar15;
  (*(pMVar1->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[2])(pMVar1);
  fVar17 = pMVar1->halfWidth;
  fVar15 = fVar15 * fVar17;
  fVar14 = fVar15;
  (*(pMVar1->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[6])(pMVar1);
  CVar3 = _nextRow;
  fVar18 = pMVar1->halfLength;
  fVar16 = (float)local_218._0_4_ - fVar14 * fVar18;
  fVar20 = fVar17 * extraout_XMM0_Da_04;
  fVar17 = fVar17 * extraout_XMM0_Db_04;
  fVar12 = extraout_XMM0_Da_03 - fVar18 * extraout_XMM0_Da_05;
  fVar13 = extraout_XMM0_Db_03 - fVar18 * extraout_XMM0_Db_05;
  color.r_ = fVar20 + fVar12 + 0.0;
  color.g_ = fVar17 + fVar13 + 0.1;
  color.b_ = fVar15 + fVar16 + 0.0;
  fVar14 = fVar14 * fVar18 + (float)local_218._0_4_;
  fVar19 = fVar18 * extraout_XMM0_Da_05 + extraout_XMM0_Da_03;
  fVar18 = fVar18 * extraout_XMM0_Db_05 + extraout_XMM0_Db_03;
  nextRow.y = fVar17 + fVar18 + 0.1;
  nextRow.x = fVar20 + fVar19 + 0.0;
  fStack_25c = CVar3.a_;
  nextRow.z = fVar15 + fVar14 + 0.0;
  g.x = (fVar19 - fVar20) + 0.0;
  g.y = (fVar18 - fVar17) + 0.1;
  g.z = (fVar14 - fVar15) + 0.0;
  local_228.z = (fVar16 - fVar15) + 0.0;
  local_228.y = (fVar13 - fVar17) + 0.1;
  local_228.x = (fVar12 - fVar20) + 0.0;
  OpenSteer::drawQuadrangle((Vec3 *)&color,&nextRow,&g,&local_228,(Color *)&status);
  OpenSteer::Color::Color(&color,0.0,0.6,0.0,1.0);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::drawTrail
            ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)pMVar1,
             &color,(Color *)OpenSteer::gBlack);
  _status = 2.0;
  fStack_1a4 = 0.0;
  color.r_ = -2.0;
  color.g_ = 0.0;
  color.b_ = 0.0;
  OpenSteer::drawLine((Vec3 *)&status,(Vec3 *)&color,(Color *)OpenSteer::gGreen);
  _status = 0.0;
  fStack_1a4 = 0.0;
  color.r_ = 0.0;
  color.g_ = 0.0;
  color.b_ = -2.0;
  OpenSteer::drawLine((Vec3 *)&status,(Vec3 *)&color,(Color *)OpenSteer::gGreen);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&status);
  poVar6 = std::operator<<((ostream *)&status,"Speed: ");
  (*(pMVar4->vehicle->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1b])();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)extraout_XMM0_Da_06);
  poVar6 = std::operator<<(poVar6," mps (");
  (*(pMVar4->vehicle->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1b])();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)(extraout_XMM0_Da_07 / 0.44704));
  poVar6 = std::operator<<(poVar6," mph)");
  poVar6 = std::operator<<(poVar6,", average: ");
  lVar2 = *(long *)poVar6;
  *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 8) = 1;
  *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) | 4;
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,pMVar4->vehicle->totalDistance / pMVar4->vehicle->totalTime);
  std::operator<<(poVar6," mps\n\n");
  poVar6 = std::operator<<((ostream *)&status,"collisions avoided for ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(int)(OpenSteer::OpenSteerDemo::clock.totalSimulationTime -
                                  pMVar4->vehicle->timeOfLastCollision));
  std::operator<<(poVar6," seconds");
  if (0 < pMVar4->vehicle->countOfCollisionFreeTimes) {
    poVar6 = std::operator<<((ostream *)&status,"\nmean time between collisions: ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(int)(pMVar4->vehicle->sumOfCollisionFreeTimes /
                                    (float)pMVar4->vehicle->countOfCollisionFreeTimes));
    poVar6 = std::operator<<(poVar6," (");
    poVar6 = (ostream *)
             std::ostream::operator<<(poVar6,(int)pMVar4->vehicle->sumOfCollisionFreeTimes);
    poVar6 = std::operator<<(poVar6,"/");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar4->vehicle->countOfCollisionFreeTimes);
    std::operator<<(poVar6,")");
  }
  poVar6 = std::operator<<((ostream *)&status,"\n\nStuck count: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar4->vehicle->stuckCount);
  poVar6 = std::operator<<(poVar6," (");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar4->vehicle->stuckCycleCount);
  poVar6 = std::operator<<(poVar6," cycles, ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar4->vehicle->stuckOffPathCount);
  std::operator<<(poVar6," off path)");
  std::operator<<((ostream *)&status,"\n\n[F1] ");
  if ((anonymous_namespace)::MapDriver::demoSelect == 1) {
    std::operator<<((ostream *)&status,"wander, ");
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::operator<<((ostream *)&status,"follow path, ");
  }
  std::operator<<((ostream *)&status,"avoid obstacle");
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::operator<<((ostream *)&status,"\n[F2] path following direction: ");
    pcVar9 = "-1";
    if (0 < pMVar4->vehicle->pathFollowDirection) {
      pcVar9 = "+1";
    }
    std::operator<<((ostream *)&status,pcVar9);
    std::operator<<((ostream *)&status,"\n[F3] path fence: ");
    pcVar9 = "off";
    if (pMVar4->usePathFences != false) {
      pcVar9 = "on";
    }
    std::operator<<((ostream *)&status,pcVar9);
  }
  std::operator<<((ostream *)&status,"\n[F4] rocks: ");
  pcVar9 = "off";
  if (pMVar4->useRandomRocks != false) {
    pcVar9 = "on";
  }
  std::operator<<((ostream *)&status,pcVar9);
  std::operator<<((ostream *)&status,"\n[F5] prediction: ");
  pcVar9 = "linear";
  if (pMVar4->vehicle->curvedSteering != false) {
    pcVar9 = "curved";
  }
  std::operator<<((ostream *)&status,pcVar9);
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    poVar6 = std::operator<<((ostream *)&status,"\n\nLap ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar4->vehicle->lapsStarted);
    poVar6 = std::operator<<(poVar6," (completed: ");
    iVar7 = pMVar4->vehicle->lapsStarted;
    iVar8 = 0;
    if (1 < iVar7) {
      iVar8 = (int)(((float)pMVar4->vehicle->lapsFinished / (float)(iVar7 + -1)) * 100.0);
    }
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar8);
    std::operator<<(poVar6,"%)");
    poVar6 = std::operator<<((ostream *)&status,"\nHints given: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pMVar4->vehicle->hintGivenCount);
    poVar6 = std::operator<<(poVar6,", taken: ");
    std::ostream::operator<<(poVar6,pMVar4->vehicle->hintTakenCount);
  }
  std::operator<<((ostream *)&status,"\n");
  qqqRange((MapDrivePlugIn *)"WR ",(char *)&status,(anonymous_namespace)::MapDriver::savedNearestWR,
           status_00);
  qqqRange((MapDrivePlugIn *)"R  ",(char *)&status,(anonymous_namespace)::MapDriver::savedNearestR,
           status_01);
  qqqRange((MapDrivePlugIn *)"L  ",(char *)&status,(anonymous_namespace)::MapDriver::savedNearestL,
           status_02);
  qqqRange((MapDrivePlugIn *)"WL ",(char *)&status,(anonymous_namespace)::MapDriver::savedNearestWL,
           status_03);
  std::ends<char,std::char_traits<char>>((ostream *)&status);
  fVar15 = OpenSteer::drawGetWindowHeight();
  OpenSteer::Color::Color(&color,0.15,0.15,0.5,1.0);
  fVar17 = OpenSteer::drawGetWindowWidth();
  fVar18 = OpenSteer::drawGetWindowHeight();
  VVar21.y = fVar15 + -50.0;
  VVar21.x = 10.0;
  VVar21.z = 0.0;
  OpenSteer::draw2dTextAt2dLocation
            ((OpenSteer *)&status,(ostringstream *)&color,VVar21,color_00,fVar17,fVar18);
  fVar17 = OpenSteer::drawGetWindowWidth();
  fVar18 = OpenSteer::SimpleVehicle::relativeSpeed(&pMVar4->vehicle->super_SimpleVehicle);
  fVar14 = fVar17 + -20.0;
  fVar15 = pMVar4->vehicle->annoteMaxRelSpeed;
  g.x = fVar14 * fVar15 + 10.0;
  nextRow.y = 2.0;
  nextRow.z = 0.0;
  nextRow.x = g.x;
  g.y = 8.0;
  g.z = 0.0;
  fVar12 = OpenSteer::drawGetWindowWidth();
  local_218._0_4_ = fVar12;
  fVar12 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine(&nextRow,&g,(Color *)OpenSteer::gBlack,(float)local_218._0_4_,fVar12);
  if ((fVar15 != 0.0) || (NAN(fVar15))) {
    local_200 = (MapDrivePlugIn *)CONCAT44(local_200._4_4_,pMVar4->vehicle->annoteMaxRelSpeedPath);
    nextRow.y = 6.0;
    nextRow.z = 0.0;
    nextRow.x = pMVar4->vehicle->annoteMaxRelSpeedCurve * fVar14 + 10.0;
    g.y = 6.0;
    g.z = 0.0;
    g.x = fVar17 + -10.0;
    local_218._0_4_ = OpenSteer::drawGetWindowWidth();
    fVar15 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dLine(&nextRow,&g,(Color *)OpenSteer::gRed,(float)local_218._0_4_,fVar15);
    nextRow.y = 3.0;
    nextRow.z = 0.0;
    nextRow.x = local_200._0_4_ * fVar14 + 10.0;
    g.y = 4.0;
    g.z = 0.0;
    g.x = fVar17 + -10.0;
    local_218._0_4_ = OpenSteer::drawGetWindowWidth();
    fVar15 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dLine(&nextRow,&g,(Color *)OpenSteer::gGreen,(float)local_218._0_4_,fVar15);
  }
  nextRow = (Vec3)ZEXT812(0x40a0000041200000);
  g.x = fVar14 * fVar18 + 10.0;
  g.y = 5.0;
  g.z = 0.0;
  fVar15 = OpenSteer::drawGetWindowWidth();
  fVar18 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine(&nextRow,&g,(Color *)OpenSteer::gWhite,fVar15,fVar18);
  nextRow = (Vec3)ZEXT812(0x40a0000041200000);
  g.x = 10.0;
  g.y = 3.0;
  g.z = 0.0;
  fVar15 = OpenSteer::drawGetWindowWidth();
  fVar18 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine(&nextRow,&g,(Color *)OpenSteer::gWhite,fVar15,fVar18);
  g.x = fVar17 + -10.0;
  nextRow.y = 5.0;
  nextRow.z = 0.0;
  nextRow.x = g.x;
  g.y = 3.0;
  g.z = 0.0;
  fVar15 = OpenSteer::drawGetWindowWidth();
  fVar17 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine(&nextRow,&g,(Color *)OpenSteer::gWhite,fVar15,fVar17);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&status);
  return;
}

Assistant:

void redraw (const float currentTime, const float elapsedTime)
        {
            // update camera, tracking test vehicle
            OpenSteerDemo::updateCamera (currentTime, elapsedTime, vehicle);

            // draw "ground plane"  (make it 4x map size)
            const float s = MapDriver::worldSize * 2;
            const float u = -0.2f;
            drawQuadrangle (Vec3 (+s, u, +s),
                            Vec3 (+s, u, -s),
                            Vec3 (-s, u, -s),
                            Vec3 (-s, u, +s),
                            Color (0.8f, 0.7f, 0.5f)); // "sand"

            // draw map and path
            vehicle->drawMap ();
            if (vehicle->demoSelect == 2) vehicle->drawPath ();

            // draw test vehicle
            vehicle->draw ();

            // QQQ mark origin to help spot artifacts
            const float tick = 2;
            drawLine (Vec3 (tick, 0, 0), Vec3 (-tick, 0, 0), gGreen);
            drawLine (Vec3 (0, 0, tick), Vec3 (0, 0, -tick), gGreen);

            // compute conversion factor miles-per-hour to meters-per-second
            const float metersPerMile = 1609.344f;
            const float secondsPerHour = 3600;
            const float MPSperMPH = metersPerMile / secondsPerHour;

            // display status in the upper left corner of the window
            std::ostringstream status;
            status << "Speed: "
                   << (int) vehicle->speed () << " mps ("
                   << (int) (vehicle->speed () / MPSperMPH) << " mph)"
                   << ", average: "
                   << std::setprecision (1) << std::setiosflags (std::ios::fixed)
                   << vehicle->totalDistance / vehicle->totalTime

                   << " mps\n\n";
            status << "collisions avoided for "
                   << (int)(OpenSteerDemo::clock.getTotalSimulationTime () -
                            vehicle->timeOfLastCollision)
                   << " seconds";
            if (vehicle->countOfCollisionFreeTimes > 0)
            {
                status << "\nmean time between collisions: "
                       << (int) (vehicle->sumOfCollisionFreeTimes /
                                 vehicle->countOfCollisionFreeTimes)
                       << " ("
                       << (int)vehicle->sumOfCollisionFreeTimes
                       << "/"
                       << (int)vehicle->countOfCollisionFreeTimes
                       << ")";
            }

            status << "\n\nStuck count: " << vehicle->stuckCount << " (" 
                   << vehicle->stuckCycleCount << " cycles, "
                   << vehicle->stuckOffPathCount << " off path)";
            status << "\n\n[F1] ";
            if (1 == vehicle->demoSelect) status << "wander, ";
            if (2 == vehicle->demoSelect) status << "follow path, ";
            status << "avoid obstacle";

            if (2 == vehicle->demoSelect)
            {
                status << "\n[F2] path following direction: ";
                if (vehicle->pathFollowDirection>0)status<<"+1";else status<<"-1";
                status << "\n[F3] path fence: ";
                if (usePathFences) status << "on"; else status << "off";
            }

            status << "\n[F4] rocks: ";
            if (useRandomRocks) status << "on"; else status << "off";
            status << "\n[F5] prediction: ";
            if (vehicle->curvedSteering)
                status << "curved"; else status << "linear";
            if (2 == vehicle->demoSelect)
            {
                status << "\n\nLap " << vehicle->lapsStarted
                       << " (completed: "
                       << ((vehicle->lapsStarted < 2) ? 0 :
                           (int) (100 * ((float) vehicle->lapsFinished /
                                         (float) (vehicle->lapsStarted - 1))))
                       << "%)";

                status << "\nHints given: " << vehicle->hintGivenCount
                       << ", taken: " << vehicle->hintTakenCount;
            }
            status << "\n";
            qqqRange ("WR ", vehicle->savedNearestWR, status);
            qqqRange ("R  ", vehicle->savedNearestR,  status);
            qqqRange ("L  ", vehicle->savedNearestL,  status);
            qqqRange ("WL ", vehicle->savedNearestWL, status);
            status << std::ends;
            const float h = drawGetWindowHeight ();
            const Vec3 screenLocation (10, h-50, 0);
            const Color color (0.15f, 0.15f, 0.5f);
            draw2dTextAt2dLocation (status, screenLocation, color, drawGetWindowWidth(), drawGetWindowHeight());

            {
                const float v = 5;
                const float m = 10;
                const float w = drawGetWindowWidth ();
                const float f = w - (2 * m);
                const float s = vehicle->relativeSpeed ();

                // limit tick mark
                const float l = vehicle->annoteMaxRelSpeed;
                draw2dLine (Vec3 (m+(f*l), v-3, 0), Vec3 (m+(f*l),v+3, 0), gBlack, drawGetWindowWidth(), drawGetWindowHeight());
                // two "inverse speedometers" showing limits due to curvature and
                // path alignment
                if (l!=0)
                {
                    const float c = vehicle->annoteMaxRelSpeedCurve;
                    const float p = vehicle->annoteMaxRelSpeedPath;
                    draw2dLine (Vec3(m+(f*c), v+1, 0), Vec3(w-m, v+1, 0), gRed, drawGetWindowWidth(), drawGetWindowHeight());
                    draw2dLine (Vec3(m+(f*p), v-2, 0), Vec3(w-m, v-1, 0), gGreen, drawGetWindowWidth(), drawGetWindowHeight());
                }
                // speedometer: horizontal line with length proportional to speed
                draw2dLine (Vec3 (m, v, 0), Vec3 (m + (f * s), v, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
                // min and max tick marks
                draw2dLine (Vec3 (m,       v, 0), Vec3 (m,      v-2, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
                draw2dLine (Vec3 (w-m,     v, 0), Vec3 (w-m,    v-2, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
            }
        }